

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O0

Attribute * Imf_2_5::TypedAttribute<Imath_2_5::Matrix44<double>_>::makeNewAttribute(void)

{
  Attribute *pAVar1;
  
  pAVar1 = (Attribute *)operator_new(0x88);
  pAVar1[0xe]._vptr_Attribute = (_func_int **)0x0;
  pAVar1[0xf]._vptr_Attribute = (_func_int **)0x0;
  pAVar1[0xc]._vptr_Attribute = (_func_int **)0x0;
  pAVar1[0xd]._vptr_Attribute = (_func_int **)0x0;
  pAVar1[10]._vptr_Attribute = (_func_int **)0x0;
  pAVar1[0xb]._vptr_Attribute = (_func_int **)0x0;
  pAVar1[8]._vptr_Attribute = (_func_int **)0x0;
  pAVar1[9]._vptr_Attribute = (_func_int **)0x0;
  pAVar1[6]._vptr_Attribute = (_func_int **)0x0;
  pAVar1[7]._vptr_Attribute = (_func_int **)0x0;
  pAVar1[4]._vptr_Attribute = (_func_int **)0x0;
  pAVar1[5]._vptr_Attribute = (_func_int **)0x0;
  pAVar1[2]._vptr_Attribute = (_func_int **)0x0;
  pAVar1[3]._vptr_Attribute = (_func_int **)0x0;
  pAVar1->_vptr_Attribute = (_func_int **)0x0;
  pAVar1[1]._vptr_Attribute = (_func_int **)0x0;
  pAVar1[0x10]._vptr_Attribute = (_func_int **)0x0;
  TypedAttribute((TypedAttribute<Imath_2_5::Matrix44<double>_> *)0x0);
  return pAVar1;
}

Assistant:

Attribute *
TypedAttribute<T>::makeNewAttribute ()
{
    return new TypedAttribute<T>();
}